

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O1

Float pbrt::Turbulence(Point3f *p,Vector3f *dpdx,Vector3f *dpdy,Float omega,int maxOctaves)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 extraout_var_00 [60];
  float fVar17;
  undefined1 auVar18 [12];
  undefined1 in_ZMM3 [64];
  uint local_48;
  undefined1 extraout_var [60];
  
  auVar18 = in_ZMM3._4_12_;
  fVar12 = (dpdx->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar9 = ZEXT416((uint)(dpdx->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar9,auVar9);
  auVar11 = ZEXT416((uint)(dpdx->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar9 = vfmadd213ss_fma(auVar11,auVar11,auVar9);
  fVar12 = (dpdy->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar11 = ZEXT416((uint)(dpdy->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar11,auVar11);
  auVar13 = ZEXT416((uint)(dpdy->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar11 = vfmadd213ss_fma(auVar13,auVar13,auVar11);
  auVar9 = vmaxss_avx(auVar11,auVar9);
  fVar12 = logf(auVar9._0_4_);
  auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf000000),0),ZEXT416((uint)(fVar12 * 1.442695)),
                            ZEXT416(0xbf800000));
  auVar13._0_4_ = (float)maxOctaves;
  auVar13._4_12_ = auVar18;
  auVar9 = vminss_avx(auVar13,auVar11);
  uVar4 = vcmpss_avx512f(auVar11,ZEXT416(0) << 0x20,1);
  fVar5 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar9._0_4_);
  auVar9._0_4_ = fVar5;
  auVar9 = vroundss_avx(auVar9,auVar9,9);
  iVar7 = (int)auVar9._0_4_;
  fVar17 = 1.0;
  fVar12 = 1.0;
  auVar9 = ZEXT816(0);
  if (0 < iVar7) {
    fVar1 = (p->super_Tuple3<pbrt::Point3,_float>).x;
    fVar2 = (p->super_Tuple3<pbrt::Point3,_float>).y;
    fVar3 = (p->super_Tuple3<pbrt::Point3,_float>).z;
    fVar17 = 1.0;
    auVar15 = ZEXT1264(ZEXT812(0));
    iVar8 = iVar7;
    fVar12 = fVar17;
    do {
      auVar16._0_4_ = Noise(fVar12 * fVar1,fVar12 * fVar2,fVar12 * fVar3);
      auVar16._4_60_ = extraout_var;
      auVar11._8_4_ = 0x7fffffff;
      auVar11._0_8_ = 0x7fffffff7fffffff;
      auVar11._12_4_ = 0x7fffffff;
      auVar9 = vandps_avx512vl(auVar16._0_16_,auVar11);
      auVar9 = vfmadd231ss_fma(auVar15._0_16_,ZEXT416((uint)fVar17),auVar9);
      auVar15 = ZEXT1664(auVar9);
      fVar12 = fVar12 * 1.99;
      fVar17 = fVar17 * omega;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  auVar14._0_4_ = ((fVar5 - (float)iVar7) + -0.3) / 0.39999998;
  auVar14._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar11 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
  uVar4 = vcmpss_avx512f(auVar14,ZEXT816(0) << 0x20,1);
  fVar5 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar11._0_4_);
  auVar10._4_12_ = auVar11._4_12_;
  auVar10._0_4_ = fVar5;
  auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar10,ZEXT416(0x40400000));
  fVar5 = fVar5 * fVar5 * auVar11._0_4_;
  auVar15._0_4_ =
       Noise(fVar12 * (p->super_Tuple3<pbrt::Point3,_float>).x,
             fVar12 * (p->super_Tuple3<pbrt::Point3,_float>).y,
             fVar12 * (p->super_Tuple3<pbrt::Point3,_float>).z);
  auVar15._4_60_ = extraout_var_00;
  auVar6._8_4_ = 0x7fffffff;
  auVar6._0_8_ = 0x7fffffff7fffffff;
  auVar6._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx512vl(auVar15._0_16_,auVar6);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * auVar11._0_4_)),ZEXT416((uint)(1.0 - fVar5)),
                            ZEXT416(0x3e4ccccd));
  local_48 = auVar9._0_4_;
  auVar9 = vfmadd213ss_fma(auVar11,ZEXT416((uint)fVar17),ZEXT416(local_48));
  auVar15 = ZEXT1664(auVar9);
  iVar8 = maxOctaves - iVar7;
  if (iVar8 != 0 && iVar7 <= maxOctaves) {
    do {
      auVar9 = vfmadd231ss_fma(auVar15._0_16_,ZEXT416((uint)fVar17),SUB6416(ZEXT464(0x3e4ccccd),0));
      auVar15 = ZEXT1664(auVar9);
      fVar17 = fVar17 * omega;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
  }
  return auVar15._0_4_;
}

Assistant:

Float Turbulence(const Point3f &p, const Vector3f &dpdx, const Vector3f &dpdy,
                 Float omega, int maxOctaves) {
    // Compute number of octaves for antialiased FBm
    Float len2 = std::max(LengthSquared(dpdx), LengthSquared(dpdy));
    Float n = Clamp(-1 - .5f * Log2(len2), 0, maxOctaves);
    int nInt = std::floor(n);

    // Compute sum of octaves of noise for turbulence
    Float sum = 0, lambda = 1, o = 1;
    for (int i = 0; i < nInt; ++i) {
        sum += o * std::abs(Noise(lambda * p));
        lambda *= 1.99f;
        o *= omega;
    }

    // Account for contributions of clamped octaves in turbulence
    Float nPartial = n - nInt;
    sum += o * Lerp(SmoothStep(nPartial, .3f, .7f), 0.2, std::abs(Noise(lambda * p)));
    for (int i = nInt; i < maxOctaves; ++i) {
        sum += o * 0.2f;
        o *= omega;
    }

    return sum;
}